

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureGLImpl.hpp
# Opt level: O2

Uint32 __thiscall
Diligent::PipelineResourceSignatureGLImpl::GetImmutableSamplerIdx
          (PipelineResourceSignatureGLImpl *this,ResourceAttribs *Res)

{
  PipelineResourceDesc *pPVar1;
  PipelineResourceAttribsType *pPVar2;
  char (*in_RCX) [88];
  Uint32 ResIndex;
  string msg;
  
  ResIndex = *(Uint32 *)&Res->field_0x4;
  if (-1 < (int)ResIndex) {
    if (ResIndex == 0x7fffffff) {
      return 0xffffffff;
    }
    pPVar1 = PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::GetResourceDesc
                       (&this->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>,
                        ResIndex);
    if (pPVar1->ResourceType != SHADER_RESOURCE_TYPE_SAMPLER) {
      FormatString<char[26],char[77]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "GetResourceDesc(Res.SamplerInd).ResourceType == SHADER_RESOURCE_TYPE_SAMPLER",
                 (char (*) [77])in_RCX);
      in_RCX = (char (*) [88])0x89;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"GetImmutableSamplerIdx",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/PipelineResourceSignatureGLImpl.hpp"
                 ,0x89);
      std::__cxx11::string::~string((string *)&msg);
    }
    pPVar2 = PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::GetResourceAttribs
                       (&this->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>,
                        *(uint *)&Res->field_0x4 & 0x7fffffff);
    ResIndex = *(Uint32 *)&pPVar2->field_0x4;
    if (-1 < (int)ResIndex) {
      return 0xffffffff;
    }
  }
  if ((this->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).
      super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
      .m_Desc.NumImmutableSamplers <= (ResIndex & 0x7fffffff)) {
    FormatString<char[26],char[88]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "ImtblSamIdx == InvalidImmutableSamplerIndex || ImtblSamIdx < GetImmutableSamplerCount()"
               ,in_RCX);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetImmutableSamplerIdx",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/PipelineResourceSignatureGLImpl.hpp"
               ,0x8e);
    std::__cxx11::string::~string((string *)&msg);
  }
  return ResIndex & 0x7fffffff;
}

Assistant:

Uint32 GetImmutableSamplerIdx(const ResourceAttribs& Res) const
    {
        auto ImtblSamIdx = InvalidImmutableSamplerIndex;
        if (Res.IsImmutableSamplerAssigned())
            ImtblSamIdx = Res.SamplerInd;
        else if (Res.IsSamplerAssigned())
        {
            VERIFY_EXPR(GetResourceDesc(Res.SamplerInd).ResourceType == SHADER_RESOURCE_TYPE_SAMPLER);
            const auto& SamAttribs = GetResourceAttribs(Res.SamplerInd);
            if (SamAttribs.IsImmutableSamplerAssigned())
                ImtblSamIdx = SamAttribs.SamplerInd;
        }
        VERIFY_EXPR(ImtblSamIdx == InvalidImmutableSamplerIndex || ImtblSamIdx < GetImmutableSamplerCount());
        return ImtblSamIdx;
    }